

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::HexHandler::encode(HexHandler *this,JsonCodec *codec,Reader input,Builder output)

{
  ArrayPtr<const_unsigned_char> input_00;
  String local_50;
  ArrayPtr<const_char> local_38;
  JsonCodec *local_28;
  JsonCodec *codec_local;
  HexHandler *this_local;
  Reader input_local;
  
  input_00.size_ = (uchar *)input.super_ArrayPtr<const_unsigned_char>.size_;
  this_local = (HexHandler *)input.super_ArrayPtr<const_unsigned_char>.ptr;
  input_00.ptr = input_00.size_;
  local_28 = codec;
  codec_local = (JsonCodec *)this;
  input_local.super_ArrayPtr<const_unsigned_char>.ptr = input_00.size_;
  kj::encodeHex(&local_50,(kj *)this_local,input_00);
  Text::Reader::Reader((Reader *)&local_38,&local_50);
  json::Value::Builder::setString(&output,(Reader)local_38);
  kj::String::~String(&local_50);
  return;
}

Assistant:

void encode(const JsonCodec& codec, capnp::Data::Reader input,
              JsonValue::Builder output) const override {
    output.setString(kj::encodeHex(input));
  }